

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::PosixColourImpl::setColour(PosixColourImpl *this,char *_escapeCode)

{
  int iVar1;
  IContext *pIVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  char *in_RSI;
  
  pIVar2 = getCurrentContext();
  (*pIVar2->_vptr_IContext[4])();
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x150ee4);
  iVar1 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[3])();
  poVar4 = std::operator<<((ostream *)CONCAT44(extraout_var,iVar1),'\x1b');
  std::operator<<(poVar4,in_RSI);
  return;
}

Assistant:

void setColour( const char* _escapeCode ) {
            getCurrentContext().getConfig()->stream()
                << '\033' << _escapeCode;
        }